

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateContextExtTests.cpp
# Opt level: O1

void __thiscall deqp::egl::anon_unknown_3::CreateContextExtCase::deinit(CreateContextExtCase *this)

{
  pointer piVar1;
  pointer ppvVar2;
  Library *pLVar3;
  
  piVar1 = (this->m_attribList).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_attribList).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->m_attribList).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  ppvVar2 = (this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppvVar2) {
    (this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppvVar2;
  }
  if (this->m_display != (EGLDisplay)0x0) {
    pLVar3 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
    (*pLVar3->_vptr_Library[0x34])(pLVar3,this->m_display);
    this->m_display = (EGLDisplay)0x0;
  }
  return;
}

Assistant:

void CreateContextExtCase::deinit (void)
{
	m_attribList.clear();
	m_configs.clear();

	if (m_display != EGL_NO_DISPLAY)
	{
		m_eglTestCtx.getLibrary().terminate(m_display);
		m_display = EGL_NO_DISPLAY;
	}
}